

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::validateCallParamsAndResult<wasm::Call>
          (FunctionValidator *this,Call *curr,HeapType sigType,Expression *printable)

{
  Type TVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  bool bVar3;
  size_t sVar4;
  Type *pTVar5;
  Expression **ppEVar6;
  ostream *poVar7;
  undefined1 auVar8 [8];
  size_t sVar9;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  Signature SVar11;
  undefined1 local_70 [8];
  Signature sig;
  HeapType sigType_local;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  sig.results.id = sigType.id;
  bVar3 = HeapType::isSignature((HeapType *)&sig.results);
  bVar3 = shouldBeTrue<wasm::Expression*>(this,bVar3,printable,"Heap type must be a signature type")
  ;
  if (bVar3) {
    _local_70 = HeapType::getSignature((HeapType *)&sig.results);
    sVar9 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    sVar4 = wasm::Type::size((Type *)local_70);
    bVar3 = shouldBeTrue<wasm::Expression*>
                      (this,sVar9 == sVar4,printable,"call* param number must match");
    if (bVar3) {
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      local_48 = (undefined1  [8])local_70;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)printable;
      PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)local_70);
      sVar9 = 0;
      pTVar5 = (Type *)0x0;
      auVar8 = (undefined1  [8])local_70;
      while (sVar4 = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index, PVar2.index = (size_t)pTVar5, PVar2.parent = (Type *)auVar8,
            PVar10 != PVar2) {
        pTVar5 = wasm::Type::Iterator::operator*((Iterator *)local_48);
        ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,sVar9);
        bVar3 = shouldBeSubType(this,(Type)((*ppEVar6)->type).id,(Type)pTVar5->id,
                                (Expression *)
                                __begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index,"call param types must match");
        if ((!bVar3) && (this->info->quiet == false)) {
          poVar7 = getStream(this);
          poVar7 = std::operator<<(poVar7,"(on argument ");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::operator<<(poVar7,")\n");
        }
        sVar9 = sVar9 + 1;
        pTVar5 = (Type *)((long)&(__begin2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
        auVar8 = local_48;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5
        ;
      }
      TVar1.id = (curr->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id;
      if (curr->isReturn == false) {
        shouldBeEqualOrFirstIsUnreachable<wasm::Expression*,wasm::Type>
                  (this,TVar1,sig.params,
                   (Expression *)
                   __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index,"call* type must match callee return type");
      }
      else {
        shouldBeEqual<wasm::Expression*,wasm::Type>
                  (this,TVar1,(Type)0x1,
                   (Expression *)
                   __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index,"return_call* should have unreachable type");
        TVar1.id = sig.params.id;
        SVar11 = HeapType::getSignature
                           (&((this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .currFunction)->type);
        shouldBeSubType(this,TVar1,SVar11.results.id,(Expression *)sVar4,
                        "return_call* callee return type must match caller return type");
      }
    }
  }
  return;
}

Assistant:

void validateCallParamsAndResult(T* curr,
                                   HeapType sigType,
                                   Expression* printable) {
    if (!shouldBeTrue(sigType.isSignature(),
                      printable,
                      "Heap type must be a signature type")) {
      return;
    }
    auto sig = sigType.getSignature();
    if (!shouldBeTrue(curr->operands.size() == sig.params.size(),
                      printable,
                      "call* param number must match")) {
      return;
    }
    size_t i = 0;
    for (const auto& param : sig.params) {
      if (!shouldBeSubType(curr->operands[i]->type,
                           param,
                           printable,
                           "call param types must match") &&
          !info.quiet) {
        getStream() << "(on argument " << i << ")\n";
      }
      ++i;
    }
    if (curr->isReturn) {
      shouldBeEqual(curr->type,
                    Type(Type::unreachable),
                    printable,
                    "return_call* should have unreachable type");
      shouldBeSubType(
        sig.results,
        getFunction()->getResults(),
        printable,
        "return_call* callee return type must match caller return type");
    } else {
      shouldBeEqualOrFirstIsUnreachable(
        curr->type,
        sig.results,
        printable,
        "call* type must match callee return type");
    }
  }